

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

Anchor * AddAnchor(TidyDocImpl *doc,ctmbstr name,Node *node)

{
  Anchor *pAVar1;
  Bool BVar2;
  int iVar3;
  uint uVar4;
  _Anchor *p_Var5;
  tmbstr ptVar6;
  Anchor *pAVar7;
  
  p_Var5 = (_Anchor *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x18);
  ptVar6 = prvTidytmbstrdup(doc->allocator,name);
  p_Var5->name = ptVar6;
  BVar2 = prvTidyIsHTML5Mode(doc);
  if (BVar2 == no) {
    ptVar6 = prvTidytmbstrtolower(p_Var5->name);
    p_Var5->name = ptVar6;
  }
  p_Var5->node = node;
  p_Var5->next = (_Anchor *)0x0;
  iVar3 = prvTidyHTMLVersion(doc);
  if (iVar3 == 0x20000) {
    uVar4 = anchorNameHash5(name);
  }
  else {
    uVar4 = anchorNameHash(name);
  }
  pAVar1 = (doc->attribs).anchor_hash[uVar4];
  if (pAVar1 == (Anchor *)0x0) {
    pAVar7 = (Anchor *)((doc->attribs).anchor_hash + uVar4);
  }
  else {
    do {
      pAVar7 = pAVar1;
      pAVar1 = pAVar7->next;
    } while (pAVar7->next != (_Anchor *)0x0);
  }
  pAVar7->next = p_Var5;
  return (Anchor *)0x0;
}

Assistant:

static Anchor* AddAnchor( TidyDocImpl* doc, ctmbstr name, Node *node )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor *a = NewAnchor( doc, name, node );
    uint h;
    if (TY_(HTMLVersion)(doc) == HT50)
        h = anchorNameHash5(name);
    else
        h = anchorNameHash(name);

    if ( attribs->anchor_hash[h] == NULL)
         attribs->anchor_hash[h] = a;
    else
    {
        Anchor *here =  attribs->anchor_hash[h];
        while (here->next)
            here = here->next;
        here->next = a;
    }

    return attribs->anchor_hash[h];
}